

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnDelegateExpr
          (BinaryReaderObjdumpDisassemble *this,Index depth)

{
  if ((this->in_function_body == true) && (0 < this->indent_level)) {
    this->indent_level = this->indent_level + -1;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnDelegateExpr(Index depth) {
  if (!in_function_body) {
    return Result::Ok;
  }
  // Because `delegate` ends the block we need to dedent here, and
  // we don't need to dedent it in LogOpcode.
  if (indent_level > 0) {
    indent_level--;
  }
  return Result::Ok;
}